

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O3

void __thiscall NaPNStatistics::initialize(NaPNStatistics *this,bool *starter)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  NaVector::init_zero(&this->Mean);
  NaVector::init_zero(&this->RMS);
  NaVector::init_zero(&this->StdDev);
  NaVector::init_zero(&this->Min);
  NaVector::init_zero(&this->Max);
  NaVector::init_zero(&this->Sum);
  NaVector::init_zero(&this->Sum2);
  this->nGapAct = 0;
  iVar2 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[3])(this);
  if ((char)iVar2 != '\0') {
    uVar1 = this->nGapWidth;
    pcVar3 = NaPetriNode::name(&this->super_NaPetriNode);
    if (uVar1 == 0) {
      NaPrintLog("Statistics node \'%s\' has continuous computation\n",pcVar3);
    }
    else {
      NaPrintLog("Statistics node \'%s\' has floating gap %u computation\n",pcVar3,
                 (ulong)this->nGapWidth);
    }
    if ((this->mHalt & 0x3ff) == 0) {
      NaPrintLog("  and does not have halt conditions.\n");
      return;
    }
    lVar5 = 0;
    NaPrintLog("  and has next halt conditions:\n");
    lVar4 = 0;
    do {
      if (((uint)this->mHalt >> ((uint)lVar4 & 0x1f) & 1) != 0) {
        NaPrintLog("  %s[0] %s %g\n",*(undefined8 *)((long)&this->HaltCond[0].value + lVar5 * 2),
                   *(undefined8 *)((long)szId + lVar5),
                   szSign[(long)*(int *)((long)&this->HaltCond[0].sign + lVar5 * 2) + 1]);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar4 != 10);
  }
  return;
}

Assistant:

void
NaPNStatistics::initialize (bool& starter)
{
    Mean.init_zero();
    RMS.init_zero();
    StdDev.init_zero();
    Min.init_zero();
    Max.init_zero();

    Sum.init_zero();
    Sum2.init_zero();

    nGapAct = 0;

    if(is_verbose()){
      if(nGapWidth)
	NaPrintLog("Statistics node '%s' has floating gap %u computation\n",
		   name(), nGapWidth);
      else
	NaPrintLog("Statistics node '%s' has continuous computation\n",
		   name());
      if(mHalt & NaSM_ALL){
	int	id;

	NaPrintLog("  and has next halt conditions:\n");
	for(id = 0; id < NaSI_number; ++id){
	  if(mHalt & NaSIdToMask(id))
	    NaPrintLog("  %s[0] %s %g\n", szId[id],
		       szSign[1 + HaltCond[id].sign], HaltCond[id].value);
	}
      }else
	NaPrintLog("  and does not have halt conditions.\n");
    }
}